

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

us_socket_context_t *
us_create_child_socket_context(int ssl,us_socket_context_t *context,int context_ext_size)

{
  us_socket_context_options_t options_00;
  us_internal_ssl_socket_context_t *puVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  int in_EDI;
  undefined1 in_stack_00000000 [16];
  us_socket_context_options_t options;
  undefined1 local_50 [12];
  int in_stack_ffffffffffffffbc;
  us_loop_t *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  undefined8 in_stack_fffffffffffffff8;
  
  if (in_EDI == 0) {
    memset(local_50,0,0x30);
    options_00.key_file_name._4_4_ = in_EDX;
    options_00.key_file_name._0_4_ = in_stack_ffffffffffffffe0;
    options_00.cert_file_name = (char *)in_RSI;
    options_00.passphrase._0_4_ = in_stack_fffffffffffffff0;
    options_00.passphrase._4_4_ = in_EDI;
    options_00.dh_params_file_name = (char *)in_stack_fffffffffffffff8;
    options_00._32_16_ = in_stack_00000000;
    puVar1 = (us_internal_ssl_socket_context_t *)
             us_create_socket_context
                       (in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                        in_stack_ffffffffffffffbc,options_00);
  }
  else {
    puVar1 = us_internal_create_child_ssl_socket_context
                       ((us_internal_ssl_socket_context_t *)
                        CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  }
  return &puVar1->sc;
}

Assistant:

struct us_socket_context_t *us_create_child_socket_context(int ssl, struct us_socket_context_t *context, int context_ext_size) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return (struct us_socket_context_t *) us_internal_create_child_ssl_socket_context((struct us_internal_ssl_socket_context_t *) context, context_ext_size);
    }
#endif

    /* For TCP we simply create a new context as nothing is shared */
    struct us_socket_context_options_t options = {0};
    return us_create_socket_context(ssl, context->loop, context_ext_size, options);
}